

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS ref_phys_mut_sa(REF_DBL turb,REF_DBL rho,REF_DBL nu,REF_DBL *mut_sa)

{
  REF_DBL RVar1;
  double dVar2;
  
  RVar1 = 0.0;
  if (((0.0 < turb) && (0.0 < rho)) && (0.0 < nu)) {
    dVar2 = nu * 1e+20;
    if (dVar2 <= -dVar2) {
      dVar2 = -dVar2;
    }
    if (dVar2 <= turb) {
      return 4;
    }
    dVar2 = pow(turb / nu,3.0);
    RVar1 = rho * turb * (dVar2 / (dVar2 + 357.91099999999994));
  }
  *mut_sa = RVar1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_mut_sa(REF_DBL turb, REF_DBL rho, REF_DBL nu,
                                   REF_DBL *mut_sa) {
  if (turb > 0.0 && rho > 0.0 && nu > 0.0) {
    REF_DBL chi, chi3, fv1;
    REF_DBL cv1 = 7.1;
    if (!ref_math_divisible(turb, nu)) return REF_DIV_ZERO;
    chi = turb / nu;
    chi3 = pow(chi, 3);
    fv1 = chi3 / (chi3 + pow(cv1, 3));
    *mut_sa = rho * turb * fv1;
  } else {
    *mut_sa = 0.0;
  }
  return REF_SUCCESS;
}